

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O0

void __thiscall
duckdb::AggregateFunction::AggregateFunction
          (AggregateFunction *this,string *name,vector<duckdb::LogicalType,_true> *arguments,
          LogicalType *return_type,aggregate_size_t state_size,aggregate_initialize_t initialize,
          aggregate_update_t update,aggregate_combine_t combine,aggregate_finalize_t finalize,
          aggregate_simple_update_t simple_update,bind_aggregate_function_t bind,
          aggregate_destructor_t destructor,aggregate_statistics_t statistics,
          aggregate_window_t window,aggregate_serialize_t serialize,
          aggregate_deserialize_t deserialize)

{
  LogicalType *in_RCX;
  string *in_RSI;
  BaseScalarFunction *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  undefined8 in_stack_00000038;
  undefined8 in_stack_00000040;
  undefined8 in_stack_00000048;
  undefined8 in_stack_00000050;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  LogicalType local_a8 [24];
  LogicalType local_90 [40];
  undefined1 local_68 [24];
  string local_50 [32];
  undefined8 local_30;
  undefined8 local_28;
  LogicalType *local_20;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  std::__cxx11::string::string(local_50,in_RSI);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (vector<duckdb::LogicalType,_true> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  duckdb::LogicalType::LogicalType(local_90,local_20);
  duckdb::LogicalType::LogicalType(local_a8,INVALID);
  duckdb::BaseScalarFunction::BaseScalarFunction(in_RDI,local_50,local_68,local_90,0,local_a8,0,0);
  duckdb::LogicalType::~LogicalType(local_a8);
  duckdb::LogicalType::~LogicalType(local_90);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x51a11d);
  std::__cxx11::string::~string(local_50);
  *(undefined ***)in_RDI = &PTR__AggregateFunction_00a17e70;
  *(undefined8 *)(in_RDI + 0xb0) = local_28;
  *(undefined8 *)(in_RDI + 0xb8) = local_30;
  *(undefined8 *)(in_RDI + 0xc0) = in_stack_00000008;
  *(undefined8 *)(in_RDI + 200) = in_stack_00000010;
  *(undefined8 *)(in_RDI + 0xd0) = in_stack_00000018;
  *(undefined8 *)(in_RDI + 0xd8) = in_stack_00000020;
  *(undefined8 *)(in_RDI + 0xe0) = in_stack_00000040;
  *(undefined8 *)(in_RDI + 0xe8) = 0;
  *(undefined8 *)(in_RDI + 0xf0) = in_stack_00000028;
  *(undefined8 *)(in_RDI + 0xf8) = in_stack_00000030;
  *(undefined8 *)(in_RDI + 0x100) = in_stack_00000038;
  *(undefined8 *)(in_RDI + 0x108) = in_stack_00000048;
  *(undefined8 *)(in_RDI + 0x110) = in_stack_00000050;
  in_RDI[0x118] = (BaseScalarFunction)0x1;
  in_RDI[0x119] = (BaseScalarFunction)0x1;
  shared_ptr<duckdb::AggregateFunctionInfo,_true>::shared_ptr
            ((shared_ptr<duckdb::AggregateFunctionInfo,_true> *)0x51a213);
  return;
}

Assistant:

AggregateFunction(const string &name, const vector<LogicalType> &arguments, const LogicalType &return_type,
	                  aggregate_size_t state_size, aggregate_initialize_t initialize, aggregate_update_t update,
	                  aggregate_combine_t combine, aggregate_finalize_t finalize,
	                  aggregate_simple_update_t simple_update = nullptr, bind_aggregate_function_t bind = nullptr,
	                  aggregate_destructor_t destructor = nullptr, aggregate_statistics_t statistics = nullptr,
	                  aggregate_window_t window = nullptr, aggregate_serialize_t serialize = nullptr,
	                  aggregate_deserialize_t deserialize = nullptr)
	    : BaseScalarFunction(name, arguments, return_type, FunctionStability::CONSISTENT,
	                         LogicalType(LogicalTypeId::INVALID)),
	      state_size(state_size), initialize(initialize), update(update), combine(combine), finalize(finalize),
	      simple_update(simple_update), window(window), bind(bind), destructor(destructor), statistics(statistics),
	      serialize(serialize), deserialize(deserialize), order_dependent(AggregateOrderDependent::ORDER_DEPENDENT),
	      distinct_dependent(AggregateDistinctDependent::DISTINCT_DEPENDENT) {
	}